

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O2

bool deqp::gls::anon_unknown_1::hasAttributeAliasing
               (vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
                *attributes,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               *bindings)

{
  pointer pAVar1;
  deUint32 dVar2;
  deInt32 dVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  reference rVar8;
  vector<bool,_std::allocator<bool>_> reservedSpaces;
  _Bvector_base<std::allocator<bool>_> local_80;
  AttribType local_58;
  
  local_80._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
       (_Bit_type *)0x0;
  local_80._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  local_80._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
       (_Bit_type *)0x0;
  local_80._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  local_80._M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  lVar5 = 0;
  while( true ) {
    pAVar1 = (attributes->
             super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar4 = (long)(int)((ulong)((long)(attributes->
                                      super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1) >>
                       7);
    if (lVar4 <= lVar5) break;
    dVar3 = getBoundLocation(bindings,&pAVar1[lVar5].m_name);
    AttributeLocationTestUtil::AttribType::AttribType
              (&local_58,
               &(attributes->
                super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
                )._M_impl.super__Vector_impl_data._M_start[lVar5].m_type);
    dVar2 = local_58.m_locationSize;
    std::__cxx11::string::~string((string *)&local_58);
    if (dVar3 != -1) {
      if ((ulong)local_80._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                 _M_offset +
          ((long)local_80._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
          (long)local_80._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) *
          8 < (ulong)(dVar2 + dVar3)) {
        std::vector<bool,_std::allocator<bool>_>::resize
                  ((vector<bool,_std::allocator<bool>_> *)&local_80,(ulong)(dVar2 + dVar3),false);
      }
      uVar6 = (ulong)dVar2;
      if ((int)dVar2 < 1) {
        uVar6 = 0;
      }
      while (bVar7 = uVar6 != 0, uVar6 = uVar6 - 1, bVar7) {
        rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)&local_80,(long)dVar3);
        if ((*rVar8._M_p & rVar8._M_mask) != 0) goto LAB_01517594;
        rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)&local_80,(long)dVar3);
        *rVar8._M_p = *rVar8._M_p | rVar8._M_mask;
        dVar3 = dVar3 + 1;
      }
    }
    lVar5 = lVar5 + 1;
  }
LAB_01517594:
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_80);
  return lVar5 < lVar4;
}

Assistant:

bool hasAttributeAliasing (const vector<Attribute>& attributes, const map<string, deUint32>& bindings)
{
	vector<bool> reservedSpaces;

	for (int attribNdx = 0; attribNdx < (int)attributes.size(); attribNdx++)
	{
		const deInt32	location	= getBoundLocation(bindings, attributes[attribNdx].getName());
		const deUint32	size		= attributes[attribNdx].getType().getLocationSize();

		if (location != Attribute::LOC_UNDEF)
		{
			if (reservedSpaces.size() < location + size)
				reservedSpaces.resize(location + size, false);

			for (int i = 0; i < (int)size; i++)
			{
				if (reservedSpaces[location + i])
					return true;

				reservedSpaces[location + i] = true;
			}
		}
	}

	return false;
}